

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall
cfdcapi_psbt_CreatePsbtNotUseDescriptor_Test::TestBody
          (cfdcapi_psbt_CreatePsbtNotUseDescriptor_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  char *pcVar6;
  char *in_R9;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  char *in_stack_000003b0;
  int64_t in_stack_000003b8;
  void *in_stack_000003c0;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  uint32_t index;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  int64_t in_stack_00000598;
  uint32_t in_stack_000005a0;
  uint32_t in_stack_000005a4;
  char *in_stack_000005a8;
  AssertionResult gtest_ar_4;
  char *in_stack_000005d0;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int64_t amount1;
  AssertionResult gtest_ar_1;
  char *output;
  char *output_base64;
  char *exp_psbt;
  char *exp_psbt_base64;
  void *psbt_handle;
  int net_type;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffff8f8;
  AssertionResult *in_stack_fffffffffffff900;
  int *piVar7;
  CfdErrorCode *in_stack_fffffffffffff908;
  CfdErrorCode *pCVar8;
  char *in_stack_fffffffffffff910;
  void **in_stack_fffffffffffff918;
  AssertionResult *pAVar9;
  undefined7 in_stack_fffffffffffff938;
  undefined1 in_stack_fffffffffffff93f;
  undefined8 in_stack_fffffffffffff940;
  int result;
  undefined7 in_stack_fffffffffffff9b0;
  char *in_stack_fffffffffffff9b8;
  char **in_stack_fffffffffffffa30;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffa40;
  char *in_stack_fffffffffffffa48;
  undefined7 in_stack_fffffffffffffaa0;
  char *in_stack_fffffffffffffaa8;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffabc;
  uint32_t index_00;
  char *in_stack_fffffffffffffac0;
  AssertHelper local_488;
  Message local_480;
  undefined4 local_474;
  AssertionResult local_470;
  AssertHelper local_460;
  Message local_458;
  undefined4 local_44c;
  AssertionResult local_448;
  AssertHelper local_438;
  Message local_430;
  AssertionResult local_428;
  AssertHelper local_418;
  Message local_410;
  AssertionResult local_408;
  AssertHelper local_3f8;
  Message local_3f0;
  undefined4 local_3e4;
  AssertionResult local_3e0;
  AssertHelper local_3d0;
  Message local_3c8;
  undefined4 local_3bc;
  AssertionResult local_3b8;
  AssertHelper local_3a8;
  Message local_3a0;
  undefined4 local_394;
  AssertionResult local_390;
  AssertHelper local_380;
  Message local_378;
  undefined4 local_36c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffca0;
  AssertHelper in_stack_fffffffffffffca8;
  uint32_t in_stack_fffffffffffffcb4;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  void *in_stack_fffffffffffffcc0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcc8;
  AssertHelper local_330;
  Message local_328;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  AssertionResult local_318;
  AssertHelper local_308;
  Message local_300;
  undefined4 local_2f4;
  AssertionResult local_2f0;
  undefined4 local_2dc;
  AssertHelper local_2d8;
  Message local_2d0;
  undefined4 local_2c4;
  AssertionResult local_2c0;
  AssertHelper local_2b0;
  Message local_2a8;
  undefined4 local_29c;
  AssertionResult local_298;
  AssertHelper local_288;
  Message local_280;
  undefined4 local_274;
  AssertionResult local_270;
  AssertHelper local_260;
  Message local_258;
  undefined4 local_24c;
  AssertionResult local_248;
  AssertHelper local_238;
  Message local_230;
  undefined4 local_224;
  uint32_t in_stack_fffffffffffffde8;
  uint32_t in_stack_fffffffffffffdec;
  AssertHelper in_stack_fffffffffffffdf0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffe04;
  void *in_stack_fffffffffffffe08;
  AssertHelper local_1e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe20;
  AssertionResult local_1d0;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined4 local_1ac;
  AssertionResult local_1a8;
  AssertHelper local_198;
  Message local_190;
  undefined4 local_184;
  AssertionResult local_180;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_15c;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  undefined4 local_134;
  AssertionResult local_130;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  undefined8 local_f8;
  AssertHelper local_f0;
  Message local_e8;
  undefined4 local_dc;
  AssertionResult local_d8;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined4 local_9c;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  result = (int)((ulong)in_stack_fffffffffffff940 >> 0x20);
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffff918);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908,
             (int *)in_stack_fffffffffffff900);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x38e53a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x2e3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x38e59d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x38e5f2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,(type *)0x38e626);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x2e4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x38e722);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x38e79d);
  local_9c = 1;
  local_a8 = 0;
  local_b0 = 
  "cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA=="
  ;
  local_b8 = 
  "70736274ff0100fd3e010200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c0000800000008000000080010000000100000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000"
  ;
  local_c0 = (char *)0x0;
  local_c8 = (char *)0x0;
  local_14 = CfdCreatePsbtHandle(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                                 (char *)in_stack_fffffffffffffdf8.ptr_,
                                 (char *)in_stack_fffffffffffffdf0.data_,in_stack_fffffffffffffdec,
                                 in_stack_fffffffffffffde8,(void **)in_stack_fffffffffffffe20.ptr_);
  local_dc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908,
             (int *)in_stack_fffffffffffff900);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x38e8d3);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x2ee,pcVar5);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message((Message *)0x38e936);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x38e98e);
  if (local_14 == 0) {
    local_f8 = 10000000;
    piVar7 = (int *)0x89756b;
    pCVar8 = (CfdErrorCode *)0x0;
    local_14 = CfdAddPsbtTxInWithPubkey
                         (gtest_ar_4.message_.ptr_,(void *)gtest_ar_4._0_8_,in_stack_000005a8,
                          in_stack_000005a4,in_stack_000005a0,in_stack_00000598,in_stack_000005d0,
                          (char *)gtest_ar_3._0_8_,(char *)gtest_ar_3.message_.ptr_);
    local_10c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,pCVar8,piVar7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x38eaab);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x2f6,pcVar5);
      testing::internal::AssertHelper::operator=(&local_120,&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      testing::Message::~Message((Message *)0x38eb0e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38eb66);
    CfdcapiPsbtDumpLog(result,(void *)CONCAT17(in_stack_fffffffffffff93f,in_stack_fffffffffffff938))
    ;
    local_14 = CfdSetPsbtTxInBip32Pubkey
                         (in_stack_fffffffffffffcc8.ptr_,in_stack_fffffffffffffcc0,
                          (char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                          in_stack_fffffffffffffcb4,(char *)in_stack_fffffffffffffca8.data_,
                          (char *)in_stack_fffffffffffffca0.ptr_,
                          (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    local_134 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,pCVar8,piVar7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
    if (!bVar1) {
      testing::Message::Message(&local_140);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x38ec6a);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x2fc,pcVar5);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x38eccd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38ed25);
    piVar7 = (int *)0x89756b;
    pCVar8 = (CfdErrorCode *)0x0;
    local_14 = CfdAddPsbtTxInWithPubkey
                         (gtest_ar_4.message_.ptr_,(void *)gtest_ar_4._0_8_,in_stack_000005a8,
                          in_stack_000005a4,in_stack_000005a0,in_stack_00000598,in_stack_000005d0,
                          (char *)gtest_ar_3._0_8_,(char *)gtest_ar_3.message_.ptr_);
    local_15c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,pCVar8,piVar7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x38ee28);
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x303,pcVar5);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      testing::Message::~Message((Message *)0x38ee8b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38eee3);
    local_14 = CfdSetPsbtTxInBip32Pubkey
                         (in_stack_fffffffffffffcc8.ptr_,in_stack_fffffffffffffcc0,
                          (char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                          in_stack_fffffffffffffcb4,(char *)in_stack_fffffffffffffca8.data_,
                          (char *)in_stack_fffffffffffffca0.ptr_,
                          (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    local_184 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,pCVar8,piVar7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x38efd3);
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x308,pcVar5);
      testing::internal::AssertHelper::operator=(&local_198,&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      testing::Message::~Message((Message *)0x38f036);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38f08e);
    piVar7 = (int *)0x89756b;
    pCVar8 = (CfdErrorCode *)0x0;
    local_14 = CfdAddPsbtTxInWithPubkey
                         (gtest_ar_4.message_.ptr_,(void *)gtest_ar_4._0_8_,in_stack_000005a8,
                          in_stack_000005a4,in_stack_000005a0,in_stack_00000598,in_stack_000005d0,
                          (char *)gtest_ar_3._0_8_,(char *)gtest_ar_3.message_.ptr_);
    local_1ac = 0;
    pAVar9 = &local_1a8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,pCVar8,piVar7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      in_stack_fffffffffffffac0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x38f191);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x30f,in_stack_fffffffffffffac0);
      testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      testing::Message::~Message((Message *)0x38f1f4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38f24c);
    local_14 = CfdSetPsbtTxInBip32Pubkey
                         (in_stack_fffffffffffffcc8.ptr_,in_stack_fffffffffffffcc0,
                          (char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                          in_stack_fffffffffffffcb4,(char *)in_stack_fffffffffffffca8.data_,
                          (char *)in_stack_fffffffffffffca0.ptr_,
                          (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    this_01 = &local_1d0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,pCVar8,piVar7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
    index_00 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffabc);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffe20);
      in_stack_fffffffffffffaa8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x38f33c);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x314,in_stack_fffffffffffffaa8);
      testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&stack0xfffffffffffffe20);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      testing::Message::~Message((Message *)0x38f39f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38f3f7);
    piVar7 = (int *)0x89756b;
    pCVar8 = (CfdErrorCode *)0x0;
    local_14 = CfdAddPsbtTxInWithPubkey
                         (gtest_ar_4.message_.ptr_,(void *)gtest_ar_4._0_8_,in_stack_000005a8,
                          in_stack_000005a4,in_stack_000005a0,in_stack_00000598,in_stack_000005d0,
                          (char *)gtest_ar_3._0_8_,(char *)gtest_ar_3.message_.ptr_);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,pCVar8,piVar7);
    uVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffe08);
    if (!(bool)uVar2) {
      testing::Message::Message((Message *)&stack0xfffffffffffffdf8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x38f4fa);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffdf0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x31b,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffdf0,(Message *)&stack0xfffffffffffffdf8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffdf0);
      testing::Message::~Message((Message *)0x38f55d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38f5b5);
    local_14 = CfdSetPsbtTxInBip32Pubkey
                         (in_stack_fffffffffffffcc8.ptr_,in_stack_fffffffffffffcc0,
                          (char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                          in_stack_fffffffffffffcb4,(char *)in_stack_fffffffffffffca8.data_,
                          (char *)in_stack_fffffffffffffca0.ptr_,
                          (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    local_224 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,pCVar8,piVar7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffde0);
    if (!bVar1) {
      testing::Message::Message(&local_230);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x38f6a5);
      testing::internal::AssertHelper::AssertHelper
                (&local_238,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,800,pcVar5);
      testing::internal::AssertHelper::operator=(&local_238,&local_230);
      testing::internal::AssertHelper::~AssertHelper(&local_238);
      testing::Message::~Message((Message *)0x38f708);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38f760);
    piVar7 = (int *)0x89756b;
    pCVar8 = (CfdErrorCode *)0x0;
    local_14 = CfdAddPsbtTxInWithPubkey
                         (gtest_ar_4.message_.ptr_,(void *)gtest_ar_4._0_8_,in_stack_000005a8,
                          in_stack_000005a4,in_stack_000005a0,in_stack_00000598,in_stack_000005d0,
                          (char *)gtest_ar_3._0_8_,(char *)gtest_ar_3.message_.ptr_);
    local_24c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,pCVar8,piVar7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_248);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x38f863);
      testing::internal::AssertHelper::AssertHelper
                (&local_260,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x327,pcVar5);
      testing::internal::AssertHelper::operator=(&local_260,&local_258);
      testing::internal::AssertHelper::~AssertHelper(&local_260);
      testing::Message::~Message((Message *)0x38f8c6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38f91e);
    local_14 = CfdSetPsbtTxInBip32Pubkey
                         (in_stack_fffffffffffffcc8.ptr_,in_stack_fffffffffffffcc0,
                          (char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                          in_stack_fffffffffffffcb4,(char *)in_stack_fffffffffffffca8.data_,
                          (char *)in_stack_fffffffffffffca0.ptr_,
                          (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    local_274 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,pCVar8,piVar7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
    if (!bVar1) {
      testing::Message::Message(&local_280);
      in_stack_fffffffffffffa48 =
           testing::AssertionResult::failure_message((AssertionResult *)0x38fa0e);
      testing::internal::AssertHelper::AssertHelper
                (&local_288,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x32c,in_stack_fffffffffffffa48);
      testing::internal::AssertHelper::operator=(&local_288,&local_280);
      testing::internal::AssertHelper::~AssertHelper(&local_288);
      testing::Message::~Message((Message *)0x38fa71);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38fac9);
    in_stack_fffffffffffff900 = (AssertionResult *)0x89756b;
    in_stack_fffffffffffff908 = (CfdErrorCode *)0x0;
    local_14 = CfdAddPsbtTxInWithPubkey
                         (gtest_ar_4.message_.ptr_,(void *)gtest_ar_4._0_8_,in_stack_000005a8,
                          in_stack_000005a4,in_stack_000005a0,in_stack_00000598,in_stack_000005d0,
                          (char *)gtest_ar_3._0_8_,(char *)gtest_ar_3.message_.ptr_);
    local_29c = 0;
    this_00 = &local_298;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908
               ,(int *)in_stack_fffffffffffff900);
    uVar3 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!(bool)uVar3) {
      testing::Message::Message(&local_2a8);
      in_stack_fffffffffffffa30 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x38fbca);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x333,(char *)in_stack_fffffffffffffa30);
      testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
      testing::internal::AssertHelper::~AssertHelper(&local_2b0);
      testing::Message::~Message((Message *)0x38fc2d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38fc85);
    pcVar5 = "44h/0h/0h/1/1";
    local_14 = CfdSetPsbtTxInBip32Pubkey
                         (in_stack_fffffffffffffcc8.ptr_,in_stack_fffffffffffffcc0,
                          (char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                          in_stack_fffffffffffffcb4,(char *)in_stack_fffffffffffffca8.data_,
                          (char *)in_stack_fffffffffffffca0.ptr_,
                          (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    local_2c4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908
               ,(int *)in_stack_fffffffffffff900);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c0);
    if (!bVar1) {
      testing::Message::Message(&local_2d0);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x38fd75);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x338,pcVar6);
      testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
      testing::internal::AssertHelper::~AssertHelper(&local_2d8);
      testing::Message::~Message((Message *)0x38fdd8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38fe30);
    local_2dc = 0;
    local_14 = CfdAddPsbtTxOutWithPubkey
                         ((void *)gtest_ar_16._0_8_,in_stack_000003c0,in_stack_000003b8,
                          in_stack_000003b0,(char *)gtest_ar_17.message_.ptr_,
                          (uint32_t *)gtest_ar_17._0_8_);
    local_2f4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908
               ,(int *)in_stack_fffffffffffff900);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
    if (!bVar1) {
      testing::Message::Message(&local_300);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x38ff1f);
      testing::internal::AssertHelper::AssertHelper
                (&local_308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x33f,pcVar6);
      testing::internal::AssertHelper::operator=(&local_308,&local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_308);
      testing::Message::~Message((Message *)0x38ff82);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38ffd7);
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908
               ,(uint *)in_stack_fffffffffffff900,pcVar5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
    if (!bVar1) {
      testing::Message::Message(&local_328);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x390089);
      testing::internal::AssertHelper::AssertHelper
                (&local_330,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x340,pcVar5);
      testing::internal::AssertHelper::operator=(&local_330,&local_328);
      testing::internal::AssertHelper::~AssertHelper(&local_330);
      testing::Message::~Message((Message *)0x3900ec);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x390144);
    local_14 = CfdSetPsbtTxOutBip32Pubkey
                         (pAVar9,in_stack_fffffffffffffac0,index_00,&this_01->success_,
                          in_stack_fffffffffffffaa8,
                          (char *)CONCAT17(uVar2,in_stack_fffffffffffffaa0));
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908
               ,(int *)in_stack_fffffffffffff900);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffcc0);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffcb0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x390229);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffca8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x344,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffca8,(Message *)&stack0xfffffffffffffcb0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffca8);
      testing::Message::~Message((Message *)0x39028c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3902e4);
    local_14 = CfdAddPsbtTxOutWithPubkey
                         ((void *)gtest_ar_16._0_8_,in_stack_000003c0,in_stack_000003b8,
                          in_stack_000003b0,(char *)gtest_ar_17.message_.ptr_,
                          (uint32_t *)gtest_ar_17._0_8_);
    local_36c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908
               ,(int *)in_stack_fffffffffffff900);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffc98);
    if (!bVar1) {
      testing::Message::Message(&local_378);
      in_stack_fffffffffffff9b8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3903c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_380,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x34a,in_stack_fffffffffffff9b8);
      testing::internal::AssertHelper::operator=(&local_380,&local_378);
      testing::internal::AssertHelper::~AssertHelper(&local_380);
      testing::Message::~Message((Message *)0x39042b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x390480);
    local_394 = 1;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908
               ,(uint *)in_stack_fffffffffffff900);
    uVar4 = testing::AssertionResult::operator_cast_to_bool(&local_390);
    if (!(bool)uVar4) {
      testing::Message::Message(&local_3a0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x39052d);
      testing::internal::AssertHelper::AssertHelper
                (&local_3a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x34b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
      testing::internal::AssertHelper::~AssertHelper(&local_3a8);
      testing::Message::~Message((Message *)0x390590);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3905e8);
    local_14 = CfdSetPsbtTxOutBip32Pubkey
                         (pAVar9,in_stack_fffffffffffffac0,index_00,&this_01->success_,
                          in_stack_fffffffffffffaa8,
                          (char *)CONCAT17(uVar2,in_stack_fffffffffffffaa0));
    local_3bc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908
               ,(int *)in_stack_fffffffffffff900);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b8);
    if (!bVar1) {
      testing::Message::Message(&local_3c8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3906cd);
      testing::internal::AssertHelper::AssertHelper
                (&local_3d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x34f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
      testing::internal::AssertHelper::~AssertHelper(&local_3d0);
      testing::Message::~Message((Message *)0x390730);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x390788);
    local_14 = CfdGetPsbtData(in_stack_fffffffffffffa48,
                              (void *)CONCAT17(uVar3,in_stack_fffffffffffffa40),(char **)this_00,
                              in_stack_fffffffffffffa30);
    local_3e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908
               ,(int *)in_stack_fffffffffffff900);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
    if (!bVar1) {
      testing::Message::Message(&local_3f0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x390861);
      testing::internal::AssertHelper::AssertHelper
                (&local_3f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x352,pcVar5);
      testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper(&local_3f8);
      testing::Message::~Message((Message *)0x3908be);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x390913);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_408,"exp_psbt_base64","output_base64",local_b0,local_c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_408);
      if (!bVar1) {
        testing::Message::Message(&local_410);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3909b7);
        testing::internal::AssertHelper::AssertHelper
                  (&local_418,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x354,pcVar5);
        testing::internal::AssertHelper::operator=(&local_418,&local_410);
        testing::internal::AssertHelper::~AssertHelper(&local_418);
        testing::Message::~Message((Message *)0x390a14);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x390a69);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_428,"exp_psbt","output",local_b8,local_c8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_428);
      if (!bVar1) {
        testing::Message::Message(&local_430);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x390aff);
        testing::internal::AssertHelper::AssertHelper
                  (&local_438,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x355,pcVar5);
        testing::internal::AssertHelper::operator=(&local_438,&local_430);
        testing::internal::AssertHelper::~AssertHelper(&local_438);
        testing::Message::~Message((Message *)0x390b5c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x390bb1);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff908);
      local_c0 = (char *)0x0;
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff908);
      local_c8 = (char *)0x0;
    }
    local_14 = CfdFreePsbtHandle(in_stack_fffffffffffff9b8,
                                 (void *)CONCAT17(uVar4,in_stack_fffffffffffff9b0));
    local_44c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908
               ,(int *)in_stack_fffffffffffff900);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_448);
    if (!bVar1) {
      testing::Message::Message(&local_458);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x390ca2);
      testing::internal::AssertHelper::AssertHelper
                (&local_460,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x35d,pcVar5);
      testing::internal::AssertHelper::operator=(&local_460,&local_458);
      testing::internal::AssertHelper::~AssertHelper(&local_460);
      testing::Message::~Message((Message *)0x390cff);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x390d54);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffff908);
  local_474 = 0;
  pAVar9 = &local_470;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&pAVar9->success_,in_stack_fffffffffffff910,in_stack_fffffffffffff908,
             (int *)in_stack_fffffffffffff900);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x390e0b);
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x361,pcVar5);
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    testing::Message::~Message((Message *)0x390e68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x390ebd);
  return;
}

Assistant:

TEST(cfdcapi_psbt, CreatePsbtNotUseDescriptor) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* exp_psbt_base64 = "cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==";
  const char* exp_psbt = "70736274ff0100fd3e010200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000001011f8096980000000000160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c000080000000800000008001000000010000000001011f80969800000000001600148bf09d60b7e34f34827d8dbcb1c76390a916ca822206022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b182a7047602c000080000000800000008001000000020000000001011f8096980000000000160014f1d3ee67829225eb892ccab01e22f6a777e7e21e220602e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855182a7047602c000080000000800000008001000000030000000001011f809698000000000016001419d65f8328b2206d9970785660ec0d34808fb0752206033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44182a7047602c000080000000800000008001000000040000000001011f809698000000000016001412b7954a75efc2a20e86e32dc2d78647d6700779220602fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504182a7047602c000080000000800000008001000000050000000001011f80f0fa0200000000160014978a90460e44671a52f49a09bb59cc6794b63c89220603e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec189d6b6d862c0000800000008000000080010000000100000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000";
  char* output_base64 = nullptr;
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, "", "", 2, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    int64_t amount1 = 0x989680;
    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "de31e525f45b534afb2bbe83a5a0a40f6684722246785f81fc83e1b57cda34f8", 1,
        0xffffffff, amount1, "0014962c4e08f336d3afbc3415c9d359ae1040470520",
        "",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    CfdcapiPsbtDumpLog(ret, handle);

    ret = CfdSetPsbtTxInBip32Pubkey(handle, psbt_handle,
        "de31e525f45b534afb2bbe83a5a0a40f6684722246785f81fc83e1b57cda34f8", 1,
        "02565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe", "2a704760", "44h/0h/0h/1/1");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "8182ee7dfc1ebfd594097adfee2147f78f8e90c0e8b9e51a952476ce3b6aef5a", 2,
        0xffffffff, amount1, "00148bf09d60b7e34f34827d8dbcb1c76390a916ca82",
        "",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetPsbtTxInBip32Pubkey(handle, psbt_handle,
        "8182ee7dfc1ebfd594097adfee2147f78f8e90c0e8b9e51a952476ce3b6aef5a", 2,
        "022744cfb2436e156040ec1c8fe842d9ef9a18cb40ad41f312725390c35f7bd36b", "2a704760", "44h/0h/0h/1/2");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "3fd9692b7a7cdab3784adcc4890028e706b1e59c8e934414fd9e785249d62da9", 3,
        0xffffffff, amount1, "0014f1d3ee67829225eb892ccab01e22f6a777e7e21e",
        "",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetPsbtTxInBip32Pubkey(handle, psbt_handle,
        "3fd9692b7a7cdab3784adcc4890028e706b1e59c8e934414fd9e785249d62da9", 3,
        "02e7e8dc236fa024369408d2ce4d8508048261abc297b811604da087ad71d13855", "2a704760", "44h/0h/0h/1/3");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "d105c429100625998ac4e58464830119b581604ef5485e95451988b87b2cf7fc", 4,
        0xffffffff, amount1, "001419d65f8328b2206d9970785660ec0d34808fb075",
        "",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetPsbtTxInBip32Pubkey(handle, psbt_handle,
        "d105c429100625998ac4e58464830119b581604ef5485e95451988b87b2cf7fc", 4,
        "033d874bf19b697cf6c639659547a583b86730164a5b6db01bf20a14eb9b6adb44", "2a704760", "44h/0h/0h/1/4");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "b98f570401eb46bded2d3efb41aba9090d014f083a0ad2d232c8229a4d1abea0", 5,
        0xffffffff, amount1, "001412b7954a75efc2a20e86e32dc2d78647d6700779",
        "",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetPsbtTxInBip32Pubkey(handle, psbt_handle,
        "b98f570401eb46bded2d3efb41aba9090d014f083a0ad2d232c8229a4d1abea0", 5,
        "02fb061730dbde3c806b4a17a99f454c81282aecee6d46f4a975a94cdfd3a06504", "2a704760", "44h/0h/0h/1/5");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxInWithPubkey(handle, psbt_handle,
        "95b6bec453093ab0e4291eca70449476988c9ad6053377432c3e655bbf41a171", 1,
        0xffffffff, 0x2faf080, "0014978a90460e44671a52f49a09bb59cc6794b63c89",
        "",
        nullptr);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdSetPsbtTxInBip32Pubkey(handle, psbt_handle,
        "95b6bec453093ab0e4291eca70449476988c9ad6053377432c3e655bbf41a171", 1,
        "03e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aec", "9d6b6d86", "44h/0h/0h/1/1");
    EXPECT_EQ(kCfdSuccess, ret);

    uint32_t index = 0;
    ret = CfdAddPsbtTxOutWithPubkey(handle, psbt_handle,
        50000000, "0014b322bddce633b851ac7370ab454f0b367a0654e5",
        "",
        &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(0, index);

    ret = CfdSetPsbtTxOutBip32Pubkey(handle, psbt_handle, index,
        "03473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81", "2a704760", "44h/0h/0h/0/2");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddPsbtTxOutWithPubkey(handle, psbt_handle,
        50000000, "0014cab8c53a6e8fc0296d1cd3915a307d51c491a555",
        "",
        &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);

    ret = CfdSetPsbtTxOutBip32Pubkey(handle, psbt_handle, index,
        "036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c", "9d6b6d86", "44h/0h/0h/0/2");
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdGetPsbtData(handle, psbt_handle, &output_base64, &output);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_psbt_base64, output_base64);
      EXPECT_STREQ(exp_psbt, output);
      CfdFreeStringBuffer(output_base64);
      output_base64 = nullptr;
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}